

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Scene *pSVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  ulong uVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  int iVar10;
  AABBNodeMB4D *node1;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong *puVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  vint4 bi;
  undefined1 auVar30 [32];
  vint4 ai;
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  float fVar42;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar43 [64];
  uint uVar48;
  uint uVar49;
  uint uVar50;
  undefined1 auVar47 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  RTCFilterFunctionNArguments local_b10;
  undefined1 local_ae0 [32];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9b0 [16];
  float local_9a0 [4];
  undefined1 local_990 [16];
  float local_980 [4];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  puVar18 = local_7f8;
  local_800 = root.ptr;
  fVar42 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_a30._4_4_ = fVar42;
  local_a30._0_4_ = fVar42;
  local_a30._8_4_ = fVar42;
  local_a30._12_4_ = fVar42;
  auVar32 = ZEXT1664(local_a30);
  fVar44 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_a40._4_4_ = fVar44;
  local_a40._0_4_ = fVar44;
  local_a40._8_4_ = fVar44;
  local_a40._12_4_ = fVar44;
  auVar36 = ZEXT1664(local_a40);
  fVar45 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_a50._4_4_ = fVar45;
  local_a50._0_4_ = fVar45;
  local_a50._8_4_ = fVar45;
  local_a50._12_4_ = fVar45;
  auVar37 = ZEXT1664(local_a50);
  fVar42 = fVar42 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar44 = fVar44 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar45 = fVar45 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar14 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_a10._8_4_ = 0x80000000;
  local_a10._0_8_ = 0x8000000080000000;
  local_a10._12_4_ = 0x80000000;
  local_a60._0_8_ = CONCAT44(fVar42,fVar42) ^ 0x8000000080000000;
  local_a60._8_4_ = -fVar42;
  local_a60._12_4_ = -fVar42;
  auVar41 = ZEXT1664(local_a60);
  local_a70._0_8_ = CONCAT44(fVar44,fVar44) ^ 0x8000000080000000;
  local_a70._8_4_ = -fVar44;
  local_a70._12_4_ = -fVar44;
  auVar43 = ZEXT1664(local_a70);
  iVar10 = (tray->tnear).field_0.i[k];
  local_a80._4_4_ = iVar10;
  local_a80._0_4_ = iVar10;
  local_a80._8_4_ = iVar10;
  local_a80._12_4_ = iVar10;
  auVar47 = ZEXT1664(local_a80);
  local_a90._0_8_ = CONCAT44(fVar45,fVar45) ^ 0x8000000080000000;
  local_a90._8_4_ = -fVar45;
  local_a90._12_4_ = -fVar45;
  auVar52 = ZEXT1664(local_a90);
  iVar10 = (tray->tfar).field_0.i[k];
  local_aa0._4_4_ = iVar10;
  local_aa0._0_4_ = iVar10;
  local_aa0._8_4_ = iVar10;
  local_aa0._12_4_ = iVar10;
  auVar55 = ZEXT1664(local_aa0);
  iVar10 = 1 << ((uint)k & 0x1f);
  auVar27._4_4_ = iVar10;
  auVar27._0_4_ = iVar10;
  auVar27._8_4_ = iVar10;
  auVar27._12_4_ = iVar10;
  auVar27._16_4_ = iVar10;
  auVar27._20_4_ = iVar10;
  auVar27._24_4_ = iVar10;
  auVar27._28_4_ = iVar10;
  auVar6 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar27 = vpand_avx2(auVar27,auVar6);
  local_940 = vpcmpeqd_avx2(auVar27,auVar6);
  bVar9 = true;
  local_a20._8_4_ = 0x7fffffff;
  local_a20._0_8_ = 0x7fffffff7fffffff;
  local_a20._12_4_ = 0x7fffffff;
  do {
    uVar20 = puVar18[-1];
    puVar18 = puVar18 + -1;
    while ((uVar20 & 8) == 0) {
      uVar11 = uVar20 & 0xfffffffffffffff0;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar23._4_4_ = uVar1;
      auVar23._0_4_ = uVar1;
      auVar23._8_4_ = uVar1;
      auVar23._12_4_ = uVar1;
      auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar19),auVar23,
                                *(undefined1 (*) [16])(uVar11 + 0x20 + uVar19));
      auVar24 = vfmadd213ps_fma(auVar24,auVar32._0_16_,auVar41._0_16_);
      auVar25 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar21),auVar23,
                                *(undefined1 (*) [16])(uVar11 + 0x20 + uVar21));
      auVar25 = vfmadd213ps_fma(auVar25,auVar36._0_16_,auVar43._0_16_);
      auVar24 = vpmaxsd_avx(auVar24,auVar25);
      auVar25 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar14),auVar23,
                                *(undefined1 (*) [16])(uVar11 + 0x20 + uVar14));
      auVar25 = vfmadd213ps_fma(auVar25,auVar37._0_16_,auVar52._0_16_);
      auVar25 = vpmaxsd_avx(auVar25,auVar47._0_16_);
      auVar24 = vpmaxsd_avx(auVar24,auVar25);
      auVar25 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + (uVar19 ^ 0x10)),auVar23,
                                *(undefined1 (*) [16])(uVar11 + 0x20 + (uVar19 ^ 0x10)));
      auVar25 = vfmadd213ps_fma(auVar25,auVar32._0_16_,auVar41._0_16_);
      auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + (uVar21 ^ 0x10)),auVar23,
                                *(undefined1 (*) [16])(uVar11 + 0x20 + (uVar21 ^ 0x10)));
      auVar34 = vfmadd213ps_fma(auVar34,auVar36._0_16_,auVar43._0_16_);
      auVar25 = vpminsd_avx(auVar25,auVar34);
      auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + (uVar14 ^ 0x10)),auVar23,
                                *(undefined1 (*) [16])(uVar11 + 0x20 + (uVar14 ^ 0x10)));
      auVar34 = vfmadd213ps_fma(auVar34,auVar37._0_16_,auVar52._0_16_);
      auVar34 = vpminsd_avx(auVar34,auVar55._0_16_);
      auVar25 = vpminsd_avx(auVar25,auVar34);
      if (((uint)uVar20 & 7) == 6) {
        auVar25 = vcmpps_avx(auVar24,auVar25,2);
        auVar24 = vcmpps_avx(*(undefined1 (*) [16])(uVar11 + 0xe0),auVar23,2);
        auVar34 = vcmpps_avx(auVar23,*(undefined1 (*) [16])(uVar11 + 0xf0),1);
        auVar24 = vandps_avx(auVar24,auVar34);
        auVar24 = vandps_avx(auVar24,auVar25);
      }
      else {
        auVar24 = vcmpps_avx(auVar24,auVar25,2);
      }
      auVar24 = vpslld_avx(auVar24,0x1f);
      uVar12 = vmovmskps_avx(auVar24);
      if (uVar12 == 0) goto joined_r0x005679e9;
      uVar12 = uVar12 & 0xff;
      lVar17 = 0;
      for (uVar20 = (ulong)uVar12; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
        lVar17 = lVar17 + 1;
      }
      uVar20 = *(ulong *)(uVar11 + lVar17 * 8);
      uVar12 = uVar12 - 1 & uVar12;
      uVar15 = (ulong)uVar12;
      if (uVar12 != 0) {
        *puVar18 = uVar20;
        lVar17 = 0;
        for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
          lVar17 = lVar17 + 1;
        }
        uVar12 = uVar12 - 1 & uVar12;
        uVar15 = (ulong)uVar12;
        bVar22 = uVar12 == 0;
        while( true ) {
          puVar18 = puVar18 + 1;
          uVar20 = *(ulong *)(uVar11 + lVar17 * 8);
          if (bVar22) break;
          *puVar18 = uVar20;
          lVar17 = 0;
          for (uVar20 = uVar15; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
            lVar17 = lVar17 + 1;
          }
          uVar15 = uVar15 - 1 & uVar15;
          bVar22 = uVar15 == 0;
        }
      }
    }
    uVar11 = (ulong)((uint)uVar20 & 0xf);
    if (uVar11 != 8) {
      uVar20 = uVar20 & 0xfffffffffffffff0;
      lVar17 = 0;
      do {
        lVar13 = lVar17 * 0x140;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar25._4_4_ = uVar1;
        auVar25._0_4_ = uVar1;
        auVar25._8_4_ = uVar1;
        auVar25._12_4_ = uVar1;
        auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0x90 + lVar13),auVar25,
                                  *(undefined1 (*) [16])(uVar20 + lVar13));
        auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xa0 + lVar13),auVar25,
                                  *(undefined1 (*) [16])(uVar20 + 0x10 + lVar13));
        auVar8 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xb0 + lVar13),auVar25,
                                 *(undefined1 (*) [16])(uVar20 + 0x20 + lVar13));
        auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xc0 + lVar13),auVar25,
                                  *(undefined1 (*) [16])(uVar20 + 0x30 + lVar13));
        auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xd0 + lVar13),auVar25,
                                  *(undefined1 (*) [16])(uVar20 + 0x40 + lVar13));
        auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xe0 + lVar13),auVar25,
                                  *(undefined1 (*) [16])(uVar20 + 0x50 + lVar13));
        auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xf0 + lVar13),auVar25,
                                  *(undefined1 (*) [16])(uVar20 + 0x60 + lVar13));
        auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0x100 + lVar13),auVar25,
                                  *(undefined1 (*) [16])(uVar20 + 0x70 + lVar13));
        auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0x110 + lVar13),auVar25,
                                  *(undefined1 (*) [16])(uVar20 + 0x80 + lVar13));
        auVar25 = vsubps_avx(auVar40,auVar24);
        auVar24 = vsubps_avx(auVar29,auVar34);
        auVar34 = vsubps_avx(auVar8,auVar23);
        auVar23 = vsubps_avx(auVar54,auVar40);
        auVar54 = vsubps_avx(auVar31,auVar29);
        auVar31 = vsubps_avx(auVar26,auVar8);
        auVar26._0_4_ = auVar24._0_4_ * auVar31._0_4_;
        auVar26._4_4_ = auVar24._4_4_ * auVar31._4_4_;
        auVar26._8_4_ = auVar24._8_4_ * auVar31._8_4_;
        auVar26._12_4_ = auVar24._12_4_ * auVar31._12_4_;
        local_970 = vfmsub231ps_fma(auVar26,auVar54,auVar34);
        auVar28._0_4_ = auVar34._0_4_ * auVar23._0_4_;
        auVar28._4_4_ = auVar34._4_4_ * auVar23._4_4_;
        auVar28._8_4_ = auVar34._8_4_ * auVar23._8_4_;
        auVar28._12_4_ = auVar34._12_4_ * auVar23._12_4_;
        local_960 = vfmsub231ps_fma(auVar28,auVar31,auVar25);
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar38._4_4_ = uVar1;
        auVar38._0_4_ = uVar1;
        auVar38._8_4_ = uVar1;
        auVar38._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar58._4_4_ = uVar1;
        auVar58._0_4_ = uVar1;
        auVar58._8_4_ = uVar1;
        auVar58._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar61._4_4_ = uVar1;
        auVar61._0_4_ = uVar1;
        auVar61._8_4_ = uVar1;
        auVar61._12_4_ = uVar1;
        fVar42 = *(float *)(ray + k * 4 + 0x80);
        auVar53._4_4_ = fVar42;
        auVar53._0_4_ = fVar42;
        auVar53._8_4_ = fVar42;
        auVar53._12_4_ = fVar42;
        auVar40 = vsubps_avx(auVar40,auVar38);
        fVar44 = *(float *)(ray + k * 4 + 0xa0);
        auVar57._4_4_ = fVar44;
        auVar57._0_4_ = fVar44;
        auVar57._8_4_ = fVar44;
        auVar57._12_4_ = fVar44;
        auVar29 = vsubps_avx(auVar29,auVar58);
        fVar45 = *(float *)(ray + k * 4 + 0xc0);
        auVar59._4_4_ = fVar45;
        auVar59._0_4_ = fVar45;
        auVar59._8_4_ = fVar45;
        auVar59._12_4_ = fVar45;
        auVar8 = vsubps_avx(auVar8,auVar61);
        auVar33._0_4_ = fVar42 * auVar29._0_4_;
        auVar33._4_4_ = fVar42 * auVar29._4_4_;
        auVar33._8_4_ = fVar42 * auVar29._8_4_;
        auVar33._12_4_ = fVar42 * auVar29._12_4_;
        auVar26 = vfmsub231ps_fma(auVar33,auVar40,auVar57);
        auVar56._0_4_ = auVar31._0_4_ * auVar26._0_4_;
        auVar56._4_4_ = auVar31._4_4_ * auVar26._4_4_;
        auVar56._8_4_ = auVar31._8_4_ * auVar26._8_4_;
        auVar56._12_4_ = auVar31._12_4_ * auVar26._12_4_;
        auVar51._0_4_ = auVar34._0_4_ * auVar26._0_4_;
        auVar51._4_4_ = auVar34._4_4_ * auVar26._4_4_;
        auVar51._8_4_ = auVar34._8_4_ * auVar26._8_4_;
        auVar51._12_4_ = auVar34._12_4_ * auVar26._12_4_;
        auVar34._0_4_ = fVar45 * auVar40._0_4_;
        auVar34._4_4_ = fVar45 * auVar40._4_4_;
        auVar34._8_4_ = fVar45 * auVar40._8_4_;
        auVar34._12_4_ = fVar45 * auVar40._12_4_;
        auVar31 = vfmsub231ps_fma(auVar34,auVar8,auVar53);
        auVar34 = vfmadd231ps_fma(auVar56,auVar31,auVar54);
        auVar31 = vfmadd231ps_fma(auVar51,auVar24,auVar31);
        auVar35._0_4_ = auVar54._0_4_ * auVar25._0_4_;
        auVar35._4_4_ = auVar54._4_4_ * auVar25._4_4_;
        auVar35._8_4_ = auVar54._8_4_ * auVar25._8_4_;
        auVar35._12_4_ = auVar54._12_4_ * auVar25._12_4_;
        local_950 = vfmsub231ps_fma(auVar35,auVar23,auVar24);
        auVar24._0_4_ = fVar44 * auVar8._0_4_;
        auVar24._4_4_ = fVar44 * auVar8._4_4_;
        auVar24._8_4_ = fVar44 * auVar8._8_4_;
        auVar24._12_4_ = fVar44 * auVar8._12_4_;
        auVar26 = vfmsub231ps_fma(auVar24,auVar29,auVar59);
        auVar60._0_4_ = fVar45 * local_950._0_4_;
        auVar60._4_4_ = fVar45 * local_950._4_4_;
        auVar60._8_4_ = fVar45 * local_950._8_4_;
        auVar60._12_4_ = fVar45 * local_950._12_4_;
        auVar24 = vfmadd231ps_fma(auVar60,local_960,auVar57);
        auVar54 = vfmadd231ps_fma(auVar24,local_970,auVar53);
        auVar34 = vfmadd231ps_fma(auVar34,auVar26,auVar23);
        auVar24 = vandps_avx(auVar54,local_a10);
        uVar12 = auVar24._0_4_;
        local_a00._0_4_ = (float)(uVar12 ^ auVar34._0_4_);
        uVar48 = auVar24._4_4_;
        local_a00._4_4_ = (float)(uVar48 ^ auVar34._4_4_);
        uVar49 = auVar24._8_4_;
        local_a00._8_4_ = (float)(uVar49 ^ auVar34._8_4_);
        uVar50 = auVar24._12_4_;
        local_a00._12_4_ = (float)(uVar50 ^ auVar34._12_4_);
        auVar24 = vfmadd231ps_fma(auVar31,auVar25,auVar26);
        local_9f0._0_4_ = (float)(uVar12 ^ auVar24._0_4_);
        local_9f0._4_4_ = (float)(uVar48 ^ auVar24._4_4_);
        local_9f0._8_4_ = (float)(uVar49 ^ auVar24._8_4_);
        local_9f0._12_4_ = (float)(uVar50 ^ auVar24._12_4_);
        auVar34 = ZEXT416(0) << 0x20;
        auVar24 = vcmpps_avx(local_a00,auVar34,5);
        auVar25 = vcmpps_avx(local_9f0,auVar34,5);
        auVar24 = vandps_avx(auVar24,auVar25);
        local_9d0 = vandps_avx(auVar54,local_a20);
        auVar25 = vcmpps_avx(auVar54,auVar34,4);
        auVar24 = vandps_avx(auVar24,auVar25);
        auVar54._0_4_ = local_a00._0_4_ + local_9f0._0_4_;
        auVar54._4_4_ = local_a00._4_4_ + local_9f0._4_4_;
        auVar54._8_4_ = local_a00._8_4_ + local_9f0._8_4_;
        auVar54._12_4_ = local_a00._12_4_ + local_9f0._12_4_;
        auVar25 = vcmpps_avx(auVar54,local_9d0,2);
        auVar34 = auVar25 & auVar24;
        if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar34[0xf] < '\0') {
          auVar24 = vandps_avx(auVar24,auVar25);
          auVar39._0_4_ = local_950._0_4_ * auVar8._0_4_;
          auVar39._4_4_ = local_950._4_4_ * auVar8._4_4_;
          auVar39._8_4_ = local_950._8_4_ * auVar8._8_4_;
          auVar39._12_4_ = local_950._12_4_ * auVar8._12_4_;
          auVar25 = vfmadd213ps_fma(auVar29,local_960,auVar39);
          auVar25 = vfmadd213ps_fma(auVar40,local_970,auVar25);
          local_9e0._0_4_ = (float)(uVar12 ^ auVar25._0_4_);
          local_9e0._4_4_ = (float)(uVar48 ^ auVar25._4_4_);
          local_9e0._8_4_ = (float)(uVar49 ^ auVar25._8_4_);
          local_9e0._12_4_ = (float)(uVar50 ^ auVar25._12_4_);
          fVar42 = *(float *)(ray + k * 4 + 0x60);
          auVar31._0_4_ = local_9d0._0_4_ * fVar42;
          auVar31._4_4_ = local_9d0._4_4_ * fVar42;
          auVar31._8_4_ = local_9d0._8_4_ * fVar42;
          auVar31._12_4_ = local_9d0._12_4_ * fVar42;
          auVar25 = vcmpps_avx(auVar31,local_9e0,1);
          fVar42 = *(float *)(ray + k * 4 + 0x100);
          auVar32 = ZEXT1664(CONCAT412(fVar42,CONCAT48(fVar42,CONCAT44(fVar42,fVar42))));
          auVar40._0_4_ = local_9d0._0_4_ * fVar42;
          auVar40._4_4_ = local_9d0._4_4_ * fVar42;
          auVar40._8_4_ = local_9d0._8_4_ * fVar42;
          auVar40._12_4_ = local_9d0._12_4_ * fVar42;
          auVar34 = vcmpps_avx(local_9e0,auVar40,2);
          auVar25 = vandps_avx(auVar25,auVar34);
          local_9b0 = vandps_avx(auVar24,auVar25);
          uVar12 = vmovmskps_avx(local_9b0);
          if (uVar12 != 0) {
            pSVar3 = context->scene;
            auVar24 = vrcpps_avx(local_9d0);
            auVar29._8_4_ = 0x3f800000;
            auVar29._0_8_ = 0x3f8000003f800000;
            auVar29._12_4_ = 0x3f800000;
            auVar25 = vfnmadd213ps_fma(local_9d0,auVar24,auVar29);
            auVar24 = vfmadd132ps_fma(auVar25,auVar24,auVar24);
            fVar42 = auVar24._0_4_;
            fVar44 = auVar24._4_4_;
            fVar45 = auVar24._8_4_;
            fVar46 = auVar24._12_4_;
            local_980[0] = fVar42 * local_9e0._0_4_;
            local_980[1] = fVar44 * local_9e0._4_4_;
            local_980[2] = fVar45 * local_9e0._8_4_;
            local_980[3] = fVar46 * local_9e0._12_4_;
            local_9a0[0] = fVar42 * local_a00._0_4_;
            local_9a0[1] = fVar44 * local_a00._4_4_;
            local_9a0[2] = fVar45 * local_a00._8_4_;
            local_9a0[3] = fVar46 * local_a00._12_4_;
            local_990._0_4_ = fVar42 * local_9f0._0_4_;
            local_990._4_4_ = fVar44 * local_9f0._4_4_;
            local_990._8_4_ = fVar45 * local_9f0._8_4_;
            local_990._12_4_ = fVar46 * local_9f0._12_4_;
            uVar15 = (ulong)(uVar12 & 0xff);
            do {
              local_ab0 = auVar32._0_16_;
              uVar7 = 0;
              for (uVar16 = uVar15; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                uVar7 = uVar7 + 1;
              }
              uVar12 = *(uint *)(lVar13 + uVar20 + 0x120 + uVar7 * 4);
              pGVar4 = (pSVar3->geometries).items[uVar12].ptr;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00567a0d:
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                  return bVar9;
                }
                uVar16 = (ulong)(uint)((int)uVar7 * 4);
                uVar1 = *(undefined4 *)((long)local_9a0 + uVar16);
                local_8c0._4_4_ = uVar1;
                local_8c0._0_4_ = uVar1;
                local_8c0._8_4_ = uVar1;
                local_8c0._12_4_ = uVar1;
                local_8c0._16_4_ = uVar1;
                local_8c0._20_4_ = uVar1;
                local_8c0._24_4_ = uVar1;
                local_8c0._28_4_ = uVar1;
                local_8a0 = *(undefined4 *)(local_990 + uVar16);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)((long)local_980 + uVar16);
                local_b10.context = context->user;
                uVar1 = *(undefined4 *)(lVar13 + uVar20 + 0x130 + uVar16);
                local_880._4_4_ = uVar1;
                local_880._0_4_ = uVar1;
                local_880._8_4_ = uVar1;
                local_880._12_4_ = uVar1;
                local_880._16_4_ = uVar1;
                local_880._20_4_ = uVar1;
                local_880._24_4_ = uVar1;
                local_880._28_4_ = uVar1;
                uVar1 = *(undefined4 *)(local_970 + uVar16);
                uVar2 = *(undefined4 *)(local_960 + uVar16);
                local_900._4_4_ = uVar2;
                local_900._0_4_ = uVar2;
                local_900._8_4_ = uVar2;
                local_900._12_4_ = uVar2;
                local_900._16_4_ = uVar2;
                local_900._20_4_ = uVar2;
                local_900._24_4_ = uVar2;
                local_900._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_950 + uVar16);
                local_8e0._4_4_ = uVar2;
                local_8e0._0_4_ = uVar2;
                local_8e0._8_4_ = uVar2;
                local_8e0._12_4_ = uVar2;
                local_8e0._16_4_ = uVar2;
                local_8e0._20_4_ = uVar2;
                local_8e0._24_4_ = uVar2;
                local_8e0._28_4_ = uVar2;
                local_860._4_4_ = uVar12;
                local_860._0_4_ = uVar12;
                local_860._8_4_ = uVar12;
                local_860._12_4_ = uVar12;
                local_860._16_4_ = uVar12;
                local_860._20_4_ = uVar12;
                local_860._24_4_ = uVar12;
                local_860._28_4_ = uVar12;
                local_920[0] = (RTCHitN)(char)uVar1;
                local_920[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[4] = (RTCHitN)(char)uVar1;
                local_920[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[8] = (RTCHitN)(char)uVar1;
                local_920[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[0xc] = (RTCHitN)(char)uVar1;
                local_920[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[0x10] = (RTCHitN)(char)uVar1;
                local_920[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[0x14] = (RTCHitN)(char)uVar1;
                local_920[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[0x18] = (RTCHitN)(char)uVar1;
                local_920[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[0x1c] = (RTCHitN)(char)uVar1;
                local_920[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                uStack_89c = local_8a0;
                uStack_898 = local_8a0;
                uStack_894 = local_8a0;
                uStack_890 = local_8a0;
                uStack_88c = local_8a0;
                uStack_888 = local_8a0;
                uStack_884 = local_8a0;
                vpcmpeqd_avx2(local_8c0,local_8c0);
                uStack_83c = (local_b10.context)->instID[0];
                local_840 = uStack_83c;
                uStack_838 = uStack_83c;
                uStack_834 = uStack_83c;
                uStack_830 = uStack_83c;
                uStack_82c = uStack_83c;
                uStack_828 = uStack_83c;
                uStack_824 = uStack_83c;
                uStack_81c = (local_b10.context)->instPrimID[0];
                local_820 = uStack_81c;
                uStack_818 = uStack_81c;
                uStack_814 = uStack_81c;
                uStack_810 = uStack_81c;
                uStack_80c = uStack_81c;
                uStack_808 = uStack_81c;
                uStack_804 = uStack_81c;
                local_ae0 = local_940;
                local_b10.valid = (int *)local_ae0;
                local_b10.geometryUserPtr = pGVar4->userPtr;
                local_b10.hit = local_920;
                local_b10.N = 8;
                local_b10.ray = (RTCRayN *)ray;
                if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar4->occlusionFilterN)(&local_b10);
                }
                auVar6 = vpcmpeqd_avx2(local_ae0,_DAT_01faff00);
                auVar27 = _DAT_01fe9960 & ~auVar6;
                if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar27 >> 0x7f,0) == '\0') &&
                      (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar27 >> 0xbf,0) == '\0') &&
                    (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar27[0x1f]) {
                  auVar6 = auVar6 ^ _DAT_01fe9960;
                }
                else {
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var5)(&local_b10);
                  }
                  auVar27 = vpcmpeqd_avx2(local_ae0,_DAT_01faff00);
                  auVar6 = auVar27 ^ _DAT_01fe9960;
                  auVar30._8_4_ = 0xff800000;
                  auVar30._0_8_ = 0xff800000ff800000;
                  auVar30._12_4_ = 0xff800000;
                  auVar30._16_4_ = 0xff800000;
                  auVar30._20_4_ = 0xff800000;
                  auVar30._24_4_ = 0xff800000;
                  auVar30._28_4_ = 0xff800000;
                  auVar27 = vblendvps_avx(auVar30,*(undefined1 (*) [32])(local_b10.ray + 0x100),
                                          auVar27);
                  *(undefined1 (*) [32])(local_b10.ray + 0x100) = auVar27;
                }
                if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar6 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar6 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar6 >> 0x7f,0) != '\0') ||
                      (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar6 >> 0xbf,0) != '\0') ||
                    (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar6[0x1f] < '\0') goto LAB_00567a0d;
                auVar32 = ZEXT1664(local_ab0);
                *(int *)(ray + k * 4 + 0x100) = local_ab0._0_4_;
              }
              uVar15 = uVar15 ^ 1L << (uVar7 & 0x3f);
            } while (uVar15 != 0);
          }
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != uVar11 - 8);
    }
    auVar32 = ZEXT1664(local_a30);
    auVar36 = ZEXT1664(local_a40);
    auVar37 = ZEXT1664(local_a50);
    auVar41 = ZEXT1664(local_a60);
    auVar43 = ZEXT1664(local_a70);
    auVar47 = ZEXT1664(local_a80);
    auVar52 = ZEXT1664(local_a90);
    auVar55 = ZEXT1664(local_aa0);
joined_r0x005679e9:
    bVar9 = puVar18 != &local_800;
    if (!bVar9) {
      return bVar9;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }